

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O2

int event_base_get_max_events(event_base *base,uint type,int clear)

{
  int iVar1;
  
  if (base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.lock)(0,base->th_base_lock);
  }
  iVar1 = 0;
  if (((type & 1) != 0) && (iVar1 = base->event_count_active_max, clear != 0)) {
    base->event_count_active_max = 0;
  }
  if (((type & 2) != 0) && (iVar1 = iVar1 + base->virtual_event_count_max, clear != 0)) {
    base->virtual_event_count_max = 0;
  }
  if (((type & 4) != 0) && (iVar1 = iVar1 + base->event_count_max, clear != 0)) {
    base->event_count_max = 0;
  }
  if (base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
  }
  return iVar1;
}

Assistant:

int
event_base_get_max_events(struct event_base *base, unsigned int type, int clear)
{
	int r = 0;

	EVBASE_ACQUIRE_LOCK(base, th_base_lock);

	if (type & EVENT_BASE_COUNT_ACTIVE) {
		r += base->event_count_active_max;
		if (clear)
			base->event_count_active_max = 0;
	}

	if (type & EVENT_BASE_COUNT_VIRTUAL) {
		r += base->virtual_event_count_max;
		if (clear)
			base->virtual_event_count_max = 0;
	}

	if (type & EVENT_BASE_COUNT_ADDED) {
		r += base->event_count_max;
		if (clear)
			base->event_count_max = 0;
	}

	EVBASE_RELEASE_LOCK(base, th_base_lock);

	return r;
}